

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

void TestCIPConstructorGraph<unsigned_long,double>
               (Polynomial<unsigned_long,_double> *polynomial,Vartype vartype,string *type)

{
  pointer *ppcVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  double *pdVar5;
  runtime_error *this;
  unsigned_long *puVar6;
  _Vector_base<int,_std::allocator<int>_> local_2a20;
  Spins init_spins_2;
  Spins init_spins_1;
  ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> system;
  Polynomial<double> poly_graph;
  BinaryPolynomialModel<unsigned_long,_double> bpm_cimod;
  random_device rnd;
  mt19937 mt;
  
  cimod::BinaryPolynomialModel<unsigned_long,_double>::BinaryPolynomialModel
            (&bpm_cimod,polynomial,vartype);
  poly_graph.poly_key_inv_._M_h._M_buckets = &poly_graph.poly_key_inv_._M_h._M_single_bucket;
  poly_graph.super_Graph._num_spins = 3;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poly_graph.poly_key_inv_._M_h._M_bucket_count = 1;
  poly_graph.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  poly_graph.poly_key_inv_._M_h._M_element_count = 0;
  poly_graph.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  poly_graph.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
  poly_graph.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cimod::BinaryPolynomialModel<unsigned_long,_double>::GetPolynomial
            ((Polynomial<unsigned_long,_double> *)&rnd,&bpm_cimod);
  puVar6 = rnd.field_0._M_mt._M_x + 2;
  while (puVar6 = (unsigned_long *)*puVar6, puVar6 != (unsigned_long *)0x0) {
    dVar2 = (double)puVar6[4];
    pdVar5 = openjij::graph::Polynomial<double>::J
                       (&poly_graph,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar6 + 1));
    *pdVar5 = dVar2;
  }
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&rnd);
  std::random_device::random_device(&rnd);
  uVar4 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar4);
  init_spins_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  init_spins_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  init_spins_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  init_spins_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  init_spins_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  init_spins_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ppcVar1 = &system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppcVar1;
  if (vartype == SPIN) {
    system.num_variables = 3;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    system.vartype = SPIN;
    system._36_4_ = 0;
    system.num_interactions_ = 0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f800000;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    openjij::graph::Graph::
    gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Spins *)&local_2a20,(Graph *)&system,&mt);
    std::vector<int,_std::allocator<int>_>::operator=
              (&init_spins_1,(vector<int,_std::allocator<int>_> *)&local_2a20);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a20);
    openjij::graph::Polynomial<double>::~Polynomial((Polynomial<double> *)&system);
    system.num_variables = 3;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    system.vartype = SPIN;
    system._36_4_ = 0;
    system.num_interactions_ = 0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f800000;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)ppcVar1;
    openjij::graph::Graph::
    gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Spins *)&local_2a20,(Graph *)&system,&mt);
    std::vector<int,_std::allocator<int>_>::operator=
              (&init_spins_2,(vector<int,_std::allocator<int>_> *)&local_2a20);
  }
  else {
    system.num_variables = 3;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    system.vartype = SPIN;
    system._36_4_ = 0;
    system.num_interactions_ = 0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f800000;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&local_2a20,(Graph *)&system,&mt);
    std::vector<int,_std::allocator<int>_>::operator=
              (&init_spins_1,(vector<int,_std::allocator<int>_> *)&local_2a20);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a20);
    openjij::graph::Polynomial<double>::~Polynomial((Polynomial<double> *)&system);
    system.num_variables = 3;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    system.variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    system.vartype = SPIN;
    system._36_4_ = 0;
    system.num_interactions_ = 0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.zero_count_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f800000;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    system.sign_key_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    system.dE_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)ppcVar1;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&local_2a20,(Graph *)&system,&mt);
    std::vector<int,_std::allocator<int>_>::operator=
              (&init_spins_2,(vector<int,_std::allocator<int>_> *)&local_2a20);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a20);
  openjij::graph::Polynomial<double>::~Polynomial((Polynomial<double> *)&system);
  openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::
  ClassicalIsingPolynomial(&system,&init_spins_1,&poly_graph,vartype);
  bVar3 = std::operator==(type,"Dense");
  if (bVar3) {
    TestCIPSystemDense<double>(&system);
    openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::reset_variables
              (&system,&init_spins_2);
    TestCIPSystemDense<double>(&system);
  }
  else {
    bVar3 = std::operator==(type,"Sparse");
    if (!bVar3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestCIPSystemSparse<double>(&system);
    openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::reset_variables
              (&system,&init_spins_2);
    TestCIPSystemSparse<double>(&system);
  }
  openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::
  ~ClassicalIsingPolynomial(&system);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&init_spins_2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&init_spins_1.super__Vector_base<int,_std::allocator<int>_>);
  std::random_device::~random_device(&rnd);
  openjij::graph::Polynomial<double>::~Polynomial(&poly_graph);
  cimod::BinaryPolynomialModel<unsigned_long,_double>::~BinaryPolynomialModel(&bpm_cimod);
  return;
}

Assistant:

void TestCIPConstructorGraph(const cimod::Polynomial<IndexType, FloatType> &polynomial, cimod::Vartype vartype, std::string type) {
   cimod::BinaryPolynomialModel<IndexType, FloatType> bpm_cimod(polynomial, vartype);
   openjij::graph::Polynomial<FloatType> poly_graph(3);
   for (const auto &it: bpm_cimod.GetPolynomial()) {
      poly_graph.J(it.first) = it.second;
   }
   std::random_device rnd;
   std::mt19937 mt(rnd());
   openjij::graph::Spins init_spins_1;
   openjij::graph::Spins init_spins_2;
   if (vartype == cimod::Vartype::SPIN) {
      init_spins_1 = openjij::graph::Polynomial<FloatType>(3).gen_spin(mt);
      init_spins_2 = openjij::graph::Polynomial<FloatType>(3).gen_spin(mt);
   }
   else {
      init_spins_1 = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
      init_spins_2 = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
   }
   auto system = openjij::system::make_classical_ising_polynomial(init_spins_1, poly_graph, vartype);
   if (type == "Dense") {
      TestCIPSystemDense(system);
      system.reset_variables(init_spins_2);
      TestCIPSystemDense(system);
   }
   else if (type == "Sparse") {
      TestCIPSystemSparse(system);
      system.reset_variables(init_spins_2);
      TestCIPSystemSparse(system);
   }
   else {
      throw std::runtime_error("Unknown type");
   }
}